

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

StateVar * __thiscall
despot::Parser::CreateStateVar
          (StateVar *__return_storage_ptr__,Parser *this,TiXmlElement *e_StateVar)

{
  int iVar1;
  char *pcVar2;
  TiXmlNode *pTVar3;
  allocator<char> local_169;
  string local_168;
  string local_148;
  int local_128;
  allocator<char> local_121;
  int num;
  undefined1 local_100 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  string value_enum_list;
  char *fully_observed;
  allocator<char> local_99;
  string local_98 [8];
  string curr_name;
  allocator<char> local_55 [13];
  string local_48 [8];
  string prev_name;
  TiXmlElement *e_StateVar_local;
  Parser *this_local;
  StateVar *state;
  
  prev_name.field_2._M_local_buf[0xf] = '\0';
  StateVar::StateVar(__return_storage_ptr__);
  pcVar2 = util::tinyxml::TiXmlElement::Attribute(e_StateVar,"vnamePrev");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,pcVar2,local_55);
  std::allocator<char>::~allocator(local_55);
  std::__cxx11::string::string((string *)(curr_name.field_2._M_local_buf + 8),local_48);
  StateVar::prev_name(__return_storage_ptr__,(string *)((long)&curr_name.field_2 + 8));
  std::__cxx11::string::~string((string *)(curr_name.field_2._M_local_buf + 8));
  pcVar2 = util::tinyxml::TiXmlElement::Attribute(e_StateVar,"vnameCurr");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,pcVar2,&local_99);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::string((string *)&fully_observed,local_98);
  StateVar::curr_name(__return_storage_ptr__,(string *)&fully_observed);
  std::__cxx11::string::~string((string *)&fully_observed);
  pcVar2 = util::tinyxml::TiXmlElement::Attribute(e_StateVar,"fullyObs");
  if (pcVar2 == (char *)0x0) {
    value_enum_list.field_2._8_8_ = anon_var_dwarf_8bb2a;
  }
  else {
    value_enum_list.field_2._8_8_ = util::tinyxml::TiXmlElement::Attribute(e_StateVar,"fullyObs");
  }
  iVar1 = strcmp((char *)value_enum_list.field_2._8_8_,"true");
  StateVar::observed(__return_storage_ptr__,iVar1 == 0);
  pTVar3 = util::tinyxml::TiXmlNode::FirstChild(&e_StateVar->super_TiXmlNode,"ValueEnum");
  if (pTVar3 == (TiXmlNode *)0x0) {
    GetFirstChildText_abi_cxx11_(&local_148,this,e_StateVar,"NumValues");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = atoi(pcVar2);
    std::__cxx11::string::~string((string *)&local_148);
    local_128 = iVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"s",&local_169);
    Variable::values((Variable *)__return_storage_ptr__,&local_168,local_128);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
  }
  else {
    GetFirstChildText_abi_cxx11_
              ((string *)
               &values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,this,e_StateVar,"ValueEnum");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&num," ",&local_121);
    Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_100,
             (string *)
             &values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&num);
    std::__cxx11::string::~string((string *)&num);
    std::allocator<char>::~allocator(&local_121);
    Variable::values((Variable *)__return_storage_ptr__,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_100);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_100);
    std::__cxx11::string::~string
              ((string *)
               &values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  prev_name.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_48);
  if ((prev_name.field_2._M_local_buf[0xf] & 1U) == 0) {
    StateVar::~StateVar(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

StateVar Parser::CreateStateVar(TiXmlElement* e_StateVar) {
	StateVar state;

	// vnamePrev
	string prev_name = e_StateVar->Attribute("vnamePrev");
	state.prev_name(prev_name);

	// vnameCurr
	string curr_name = e_StateVar->Attribute("vnameCurr");
	state.curr_name(curr_name);

	// fullyObs
	const char* fully_observed;
	if (e_StateVar->Attribute("fullyObs"))
		fully_observed = e_StateVar->Attribute("fullyObs");
	else
		fully_observed = "false"; //default is false
	state.observed(strcmp(fully_observed, "true") == 0);

	// ValueEnum or NumValues
	if (e_StateVar->FirstChild("ValueEnum")) {
		string value_enum_list = GetFirstChildText(e_StateVar, "ValueEnum");
		vector<string> values = Tokenize(value_enum_list);
		state.values(values);
	} else {
		int num = atoi(GetFirstChildText(e_StateVar, "NumValues").c_str());
		state.values("s", num);
	}

	return state;
}